

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O1

string * __thiscall
embree::stringOfCPUModel_abi_cxx11_(string *__return_storage_ptr__,embree *this,CPU model)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Xeon Ice Lake";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Core Ice Lake";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Core Tiger Lake";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Core Comet Lake";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Core Cannon Lake";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Core Kaby Lake";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Xeon Sky Lake";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Core Sky Lake";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Xeon Phi Knights Mill";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Xeon Phi Knights Landing";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Xeon Broadwell";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Core Broadwell";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Xeon Haswell";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Core Haswell";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "Xeon Ivy Bridge";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "Core Ivy Bridge";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "Sandy Bridge";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Nehalem";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "Core2";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Core";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "ARM";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Unknown CPU";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown CPU (error)";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfCPUModel(CPU model)
  {
    switch (model) {
    case CPU::XEON_ICE_LAKE           : return "Xeon Ice Lake";
    case CPU::CORE_ICE_LAKE           : return "Core Ice Lake";
    case CPU::CORE_TIGER_LAKE         : return "Core Tiger Lake";
    case CPU::CORE_COMET_LAKE         : return "Core Comet Lake";
    case CPU::CORE_CANNON_LAKE        : return "Core Cannon Lake";
    case CPU::CORE_KABY_LAKE          : return "Core Kaby Lake";
    case CPU::XEON_SKY_LAKE           : return "Xeon Sky Lake";
    case CPU::CORE_SKY_LAKE           : return "Core Sky Lake";
    case CPU::XEON_PHI_KNIGHTS_MILL   : return "Xeon Phi Knights Mill";
    case CPU::XEON_PHI_KNIGHTS_LANDING: return "Xeon Phi Knights Landing";
    case CPU::XEON_BROADWELL          : return "Xeon Broadwell";
    case CPU::CORE_BROADWELL          : return "Core Broadwell";
    case CPU::XEON_HASWELL            : return "Xeon Haswell";
    case CPU::CORE_HASWELL            : return "Core Haswell";
    case CPU::XEON_IVY_BRIDGE         : return "Xeon Ivy Bridge";
    case CPU::CORE_IVY_BRIDGE         : return "Core Ivy Bridge";
    case CPU::SANDY_BRIDGE            : return "Sandy Bridge";
    case CPU::NEHALEM                 : return "Nehalem";
    case CPU::CORE2                   : return "Core2";
    case CPU::CORE1                   : return "Core";
    case CPU::ARM                     : return "ARM";
    case CPU::UNKNOWN                 : return "Unknown CPU";
    }
    return "Unknown CPU (error)";
  }